

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPSources::Timeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  RTPInternalSourceData *pRVar2;
  HashElement *pHVar3;
  RTPMemoryManager *pRVar4;
  HashElement *pHVar5;
  uint uVar6;
  HashElement *pHVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  
  dVar11 = curtime->m_t - timeoutdelay->m_t;
  pHVar5 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar5;
  if (pHVar5 == (HashElement *)0x0) {
    iVar9 = 0;
    iVar8 = 0;
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    iVar8 = 0;
    iVar9 = 0;
    do {
      pRVar2 = pHVar5->element;
      if ((pRVar2 == this->owndata) ||
         (pRVar1 = &(pRVar2->super_RTPSourceData).stats.lastmsgtime,
         dVar11 < pRVar1->m_t || dVar11 == pRVar1->m_t)) {
        iVar10 = iVar10 + 1;
        iVar9 = iVar9 + (uint)(pRVar2->super_RTPSourceData).issender;
        uVar6 = (pRVar2->super_RTPSourceData).receivedbye ^ 1;
        if ((pRVar2->super_RTPSourceData).validated == false) {
          uVar6 = 0;
        }
        iVar8 = iVar8 + uVar6;
        (this->sourcelist).curhashelem = pHVar5->listnext;
      }
      else {
        this->totalcount = this->totalcount + -1;
        if ((pRVar2->super_RTPSourceData).issender == true) {
          this->sendercount = this->sendercount + -1;
        }
        if (((pRVar2->super_RTPSourceData).validated == true) &&
           (((pRVar2->super_RTPSourceData).receivedbye & 1U) == 0)) {
          this->activecount = this->activecount + -1;
        }
        pHVar7 = pHVar5->hashprev;
        pHVar3 = pHVar5->hashnext;
        if (pHVar7 == (HashElement *)0x0) {
          (this->sourcelist).table[pHVar5->hashindex] = pHVar3;
          if (pHVar3 != (HashElement *)0x0) {
            pHVar7 = (HashElement *)0x0;
            goto LAB_0011fd15;
          }
        }
        else {
          pHVar7->hashnext = pHVar3;
          if (pHVar3 != (HashElement *)0x0) {
LAB_0011fd15:
            pHVar3->hashprev = pHVar7;
          }
        }
        pHVar5 = (this->sourcelist).curhashelem;
        pHVar7 = pHVar5->listprev;
        pHVar3 = pHVar5->listnext;
        if (pHVar7 == (HashElement *)0x0) {
          (this->sourcelist).firsthashelem = pHVar3;
          if (pHVar3 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = (HashElement *)0x0;
          }
          else {
            pHVar3->listprev = (HashElement *)0x0;
          }
        }
        else {
          pHVar7->listnext = pHVar3;
          if (pHVar3 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = pHVar7;
          }
          else {
            pHVar3->listprev = pHVar7;
          }
        }
        pRVar4 = (this->sourcelist).super_RTPMemoryObject.mgr;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          if (pHVar5 != (HashElement *)0x0) {
            operator_delete(pHVar5,0x30);
          }
        }
        else {
          (*pRVar4->_vptr_RTPMemoryManager[3])(pRVar4,pHVar5);
        }
        (this->sourcelist).curhashelem = pHVar3;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,pRVar2);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,pRVar2);
        pRVar4 = (this->super_RTPMemoryObject).mgr;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          if (pRVar2 != (RTPInternalSourceData *)0x0) {
            (*(pRVar2->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject[1])(pRVar2);
          }
        }
        else {
          (**(pRVar2->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject)(pRVar2);
          (*pRVar4->_vptr_RTPMemoryManager[3])(pRVar4,pRVar2);
        }
      }
      pHVar5 = (this->sourcelist).curhashelem;
    } while (pHVar5 != (HashElement *)0x0);
  }
  this->totalcount = iVar10;
  this->sendercount = iVar9;
  this->activecount = iVar8;
  return;
}

Assistant:

void RTPSources::Timeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

		// we don't want to time out ourselves
		if ((srcdat != owndata) && (lastmsgtime < checktime)) // timeout
		{
			
			totalcount--;
			if (srcdat->IsSender())
				sendercount--;
			if (srcdat->IsActive())
				activecount--;
			
			sourcelist.DeleteCurrentElement();

			OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}